

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDLLoader.cpp
# Opt level: O0

bool __thiscall
Assimp::MDLImporter::ProcessFrames_3DGS_MDL7
          (MDLImporter *this,IntGroupInfo_MDL7 *groupInfo,IntGroupData_MDL7 *groupData,
          IntSharedData_MDL7 *shared,uchar *szCurrent,uchar **szCurrentOut)

{
  float fVar1;
  ushort uVar2;
  ushort uVar3;
  uchar *puVar4;
  uint uVar5;
  Logger *pLVar6;
  reference pvVar7;
  uint local_a4;
  uint iCurIndex;
  uint c;
  uint iTriangle;
  uint iOutIndex;
  Triangle_MDL7 *pcGroupTris;
  aiVector3D vNormal;
  aiVector3D vPosition;
  uint16_t iIndex;
  uint qq;
  Vertex_MDL7 *pcFrameVertices;
  undefined1 local_60 [4];
  uint iAdd;
  IntFrameInfo_MDL7 frame;
  uint iFrame;
  Header_MDL7 *pcHeader;
  uchar **szCurrentOut_local;
  uchar *szCurrent_local;
  IntSharedData_MDL7 *shared_local;
  IntGroupData_MDL7 *groupData_local;
  IntGroupInfo_MDL7 *groupInfo_local;
  MDLImporter *this_local;
  
  if (szCurrent == (uchar *)0x0) {
    __assert_fail("nullptr != szCurrent",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/MDL/MDLLoader.cpp"
                  ,0x46a,
                  "bool Assimp::MDLImporter::ProcessFrames_3DGS_MDL7(const MDL::IntGroupInfo_MDL7 &, MDL::IntGroupData_MDL7 &, MDL::IntSharedData_MDL7 &, const unsigned char *, const unsigned char **)"
                 );
  }
  if (szCurrentOut != (uchar **)0x0) {
    puVar4 = this->mBuffer;
    frame.pcFrame._4_4_ = 0;
    szCurrentOut_local = (uchar **)szCurrent;
    while( true ) {
      if ((uint)groupInfo->pcGroup->numframes <= frame.pcFrame._4_4_) {
        *szCurrentOut = (uchar *)szCurrentOut_local;
        return true;
      }
      MDL::IntFrameInfo_MDL7::IntFrameInfo_MDL7
                ((IntFrameInfo_MDL7 *)local_60,(Frame_MDL7 *)szCurrentOut_local,frame.pcFrame._4_4_)
      ;
      uVar5 = (uint)*(ushort *)(puVar4 + 0x2e) +
              *(int *)(frame._0_8_ + 0x10) * (uint)*(ushort *)(puVar4 + 0x2a) +
              *(int *)(frame._0_8_ + 0x14) * (uint)*(ushort *)(puVar4 + 0x2c);
      if ((long)(ulong)*(uint *)(puVar4 + 0x10) <
          (long)((long)szCurrentOut_local + ((ulong)uVar5 - (long)puVar4))) break;
      if (this->configFrameID == frame.pcFrame._4_4_) {
        uVar2 = *(ushort *)(puVar4 + 0x2e);
        for (vPosition.z = 0.0; (uint)vPosition.z < (uint)*(float *)(frame._0_8_ + 0x10);
            vPosition.z = (float)((int)vPosition.z + 1)) {
          uVar3 = *(ushort *)
                   ((long)szCurrentOut_local +
                   (ulong)((int)vPosition.z * (uint)*(ushort *)(puVar4 + 0x2a)) +
                   (long)(int)(uint)uVar2 + 0xc);
          if ((int)(uint)uVar3 < groupInfo->pcGroup->numverts) {
            aiVector3t<float>::aiVector3t((aiVector3t<float> *)&vNormal.y);
            aiVector3t<float>::aiVector3t((aiVector3t<float> *)&pcGroupTris);
            vNormal.y = *(float *)((long)szCurrentOut_local +
                                  (ulong)((int)vPosition.z * (uint)*(ushort *)(puVar4 + 0x2a)) +
                                  (long)(int)(uint)uVar2);
            vNormal.z = *(float *)((long)szCurrentOut_local +
                                  (ulong)((int)vPosition.z * (uint)*(ushort *)(puVar4 + 0x2a)) +
                                  (long)(int)(uint)uVar2 + 4);
            fVar1 = *(float *)((long)szCurrentOut_local +
                              (ulong)((int)vPosition.z * (uint)*(ushort *)(puVar4 + 0x2a)) +
                              (long)(int)(uint)uVar2 + 8);
            if (*(ushort *)(puVar4 + 0x28) < 0x1a) {
              if (0xf < *(ushort *)(puVar4 + 0x28)) {
                MD2::LookupNormalIndex
                          (*(uint8_t *)
                            ((long)szCurrentOut_local +
                            (ulong)((int)vPosition.z * (uint)*(ushort *)(puVar4 + 0x2a)) +
                            (long)(int)(uint)uVar2 + 0xe),(aiVector3D *)&pcGroupTris);
              }
            }
            else {
              pcGroupTris._0_4_ =
                   *(undefined4 *)
                    ((long)szCurrentOut_local +
                    (ulong)((int)vPosition.z * (uint)*(ushort *)(puVar4 + 0x2a)) +
                    (long)(int)(uint)uVar2 + 0xe);
              pcGroupTris._4_4_ =
                   *(undefined4 *)
                    ((long)szCurrentOut_local +
                    (ulong)((int)vPosition.z * (uint)*(ushort *)(puVar4 + 0x2a)) +
                    (long)(int)(uint)uVar2 + 0x12);
              vNormal.x = *(float *)((long)szCurrentOut_local +
                                    (ulong)((int)vPosition.z * (uint)*(ushort *)(puVar4 + 0x2a)) +
                                    (long)(int)(uint)uVar2 + 0x16);
            }
            _iTriangle = groupInfo->pcGroupTris;
            c = 0;
            for (iCurIndex = 0; iCurIndex < (uint)groupInfo->pcGroup->numtris;
                iCurIndex = iCurIndex + 1) {
              for (local_a4 = 0; local_a4 < 3; local_a4 = local_a4 + 1) {
                if (_iTriangle->v_index[local_a4] == uVar3) {
                  pvVar7 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::
                           operator[](&groupData->vPositions,(ulong)c);
                  pvVar7->x = vNormal.y;
                  pvVar7->y = vNormal.z;
                  pvVar7->z = fVar1;
                  pvVar7 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::
                           operator[](&groupData->vNormals,(ulong)c);
                  pvVar7->x = (float)pcGroupTris._0_4_;
                  pvVar7->y = (float)pcGroupTris._4_4_;
                  pvVar7->z = vNormal.x;
                }
                c = c + 1;
              }
              _iTriangle = (Triangle_MDL7 *)
                           ((long)_iTriangle->v_index + (long)(int)(uint)*(ushort *)(puVar4 + 0x26))
              ;
            }
          }
          else {
            pLVar6 = DefaultLogger::get();
            Logger::warn(pLVar6,"Invalid vertex index in frame vertex section");
          }
        }
      }
      if (shared->apcOutBones != (IntBone_MDL7 **)0x0) {
        ParseBoneTrafoKeys_3DGS_MDL7(this,groupInfo,(IntFrameInfo_MDL7 *)local_60,shared);
      }
      szCurrentOut_local = (uchar **)((long)szCurrentOut_local + (ulong)uVar5);
      frame.pcFrame._4_4_ = frame.pcFrame._4_4_ + 1;
    }
    pLVar6 = DefaultLogger::get();
    Logger::warn(pLVar6,
                 "Index overflow in frame area. Ignoring all frames and all further mesh groups, too."
                );
    *szCurrentOut = (uchar *)szCurrentOut_local;
    return false;
  }
  __assert_fail("nullptr != szCurrentOut",
                "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/MDL/MDLLoader.cpp"
                ,0x46b,
                "bool Assimp::MDLImporter::ProcessFrames_3DGS_MDL7(const MDL::IntGroupInfo_MDL7 &, MDL::IntGroupData_MDL7 &, MDL::IntSharedData_MDL7 &, const unsigned char *, const unsigned char **)"
               );
}

Assistant:

bool MDLImporter::ProcessFrames_3DGS_MDL7(const MDL::IntGroupInfo_MDL7& groupInfo,
    MDL::IntGroupData_MDL7&  groupData,
    MDL::IntSharedData_MDL7& shared,
    const unsigned char*     szCurrent,
    const unsigned char**    szCurrentOut)
{
    ai_assert( nullptr != szCurrent );
    ai_assert( nullptr != szCurrentOut);

    const MDL::Header_MDL7 *pcHeader = (const MDL::Header_MDL7*)mBuffer;

    // if we have no bones we can simply skip all frames,
    // otherwise we'll need to process them.
    // FIX: If we need another frame than the first we must apply frame vertex replacements ...
    for(unsigned int iFrame = 0; iFrame < (unsigned int)groupInfo.pcGroup->numframes;++iFrame)  {
        MDL::IntFrameInfo_MDL7 frame ((BE_NCONST MDL::Frame_MDL7*)szCurrent,iFrame);

        AI_SWAP4(frame.pcFrame->vertices_count);
        AI_SWAP4(frame.pcFrame->transmatrix_count);

        const unsigned int iAdd = pcHeader->frame_stc_size +
            frame.pcFrame->vertices_count * pcHeader->framevertex_stc_size +
            frame.pcFrame->transmatrix_count * pcHeader->bonetrans_stc_size;

        if (((const char*)szCurrent - (const char*)pcHeader) + iAdd > (unsigned int)pcHeader->data_size)    {
            ASSIMP_LOG_WARN("Index overflow in frame area. "
                "Ignoring all frames and all further mesh groups, too.");

            // don't parse more groups if we can't even read one
            // FIXME: sometimes this seems to occur even for valid files ...
            *szCurrentOut = szCurrent;
            return false;
        }
        // our output frame?
        if (configFrameID == iFrame)    {
            BE_NCONST MDL::Vertex_MDL7* pcFrameVertices = (BE_NCONST MDL::Vertex_MDL7*)(szCurrent+pcHeader->frame_stc_size);

            for (unsigned int qq = 0; qq < frame.pcFrame->vertices_count;++qq)  {
                // I assume this are simple replacements for normal vertices, the bone index serving
                // as the index of the vertex to be replaced.
                uint16_t iIndex = _AI_MDL7_ACCESS(pcFrameVertices,qq,pcHeader->framevertex_stc_size,MDL::Vertex_MDL7).vertindex;
                AI_SWAP2(iIndex);
                if (iIndex >= groupInfo.pcGroup->numverts)  {
                    ASSIMP_LOG_WARN("Invalid vertex index in frame vertex section");
                    continue;
                }

                aiVector3D vPosition,vNormal;

                vPosition.x = _AI_MDL7_ACCESS_VERT(pcFrameVertices,qq,pcHeader->framevertex_stc_size) .x;
                AI_SWAP4(vPosition.x);
                vPosition.y = _AI_MDL7_ACCESS_VERT(pcFrameVertices,qq,pcHeader->framevertex_stc_size) .y;
                AI_SWAP4(vPosition.y);
                vPosition.z = _AI_MDL7_ACCESS_VERT(pcFrameVertices,qq,pcHeader->framevertex_stc_size) .z;
                AI_SWAP4(vPosition.z);

                // now read the normal vector
                if (AI_MDL7_FRAMEVERTEX030305_STCSIZE <= pcHeader->mainvertex_stc_size) {
                    // read the full normal vector
                    vNormal.x = _AI_MDL7_ACCESS_VERT(pcFrameVertices,qq,pcHeader->framevertex_stc_size) .norm[0];
                    AI_SWAP4(vNormal.x);
                    vNormal.y = _AI_MDL7_ACCESS_VERT(pcFrameVertices,qq,pcHeader->framevertex_stc_size) .norm[1];
                    AI_SWAP4(vNormal.y);
                    vNormal.z = _AI_MDL7_ACCESS_VERT(pcFrameVertices,qq,pcHeader->framevertex_stc_size) .norm[2];
                    AI_SWAP4(vNormal.z);
                }
                else if (AI_MDL7_FRAMEVERTEX120503_STCSIZE <= pcHeader->mainvertex_stc_size)    {
                    // read the normal vector from Quake2's smart table
                    MD2::LookupNormalIndex(_AI_MDL7_ACCESS_VERT(pcFrameVertices,qq,
                        pcHeader->framevertex_stc_size) .norm162index,vNormal);
                }

                // FIXME: O(n^2) at the moment ...
                BE_NCONST MDL::Triangle_MDL7* pcGroupTris = groupInfo.pcGroupTris;
                unsigned int iOutIndex = 0;
                for (unsigned int iTriangle = 0; iTriangle < (unsigned int)groupInfo.pcGroup->numtris; ++iTriangle) {
                    // iterate through all indices of the current triangle
                    for (unsigned int c = 0; c < 3;++c,++iOutIndex) {
                        // replace the vertex with the new data
                        const unsigned int iCurIndex = pcGroupTris->v_index[c];
                        if (iCurIndex == iIndex)    {
                            groupData.vPositions[iOutIndex] = vPosition;
                            groupData.vNormals[iOutIndex] = vNormal;
                        }
                    }
                    // get the next triangle in the list
                    pcGroupTris = (BE_NCONST MDL::Triangle_MDL7*)((const char*)
                        pcGroupTris + pcHeader->triangle_stc_size);
                }
            }
        }
        // parse bone trafo matrix keys (only if there are bones ...)
        if (shared.apcOutBones) {
            ParseBoneTrafoKeys_3DGS_MDL7(groupInfo,frame,shared);
        }
        szCurrent += iAdd;
    }
    *szCurrentOut = szCurrent;
    return true;
}